

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_257,_false,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 aVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  BVH *bvh;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined8 uVar13;
  size_t k;
  ulong uVar14;
  long lVar15;
  undefined8 unaff_RBX;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar19 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar26 [64];
  float fVar27;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar28 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  vfloat4 a0;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  Precalculations pre;
  TravRayK<8,_false> tray;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_420;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined1 auStack_3e0 [352];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_280;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  int local_100;
  int iStack_fc;
  int iStack_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int iStack_e8;
  int iStack_e4;
  undefined1 local_e0 [32];
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    aVar1 = valid_i->field_0;
    auVar12 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar13 = vpcmpeqd_avx512vl((undefined1  [32])aVar1,auVar12);
    if ((byte)uVar13 != 0) {
      uVar16 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),(uint)(byte)uVar13);
      auVar12 = *(undefined1 (*) [32])(ray + 0x80);
      auVar2 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar3 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar5 = auVar3._0_4_;
      auVar26._0_4_ = fVar5 * fVar5;
      fVar6 = auVar3._4_4_;
      auVar26._4_4_ = fVar6 * fVar6;
      fVar7 = auVar3._8_4_;
      auVar26._8_4_ = fVar7 * fVar7;
      fVar8 = auVar3._12_4_;
      auVar26._12_4_ = fVar8 * fVar8;
      fVar9 = auVar3._16_4_;
      auVar26._16_4_ = fVar9 * fVar9;
      fVar10 = auVar3._20_4_;
      auVar26._20_4_ = fVar10 * fVar10;
      fVar11 = auVar3._24_4_;
      auVar26._28_36_ = in_ZMM4._28_36_;
      auVar26._24_4_ = fVar11 * fVar11;
      auVar35 = vfmadd231ps_fma(auVar26._0_32_,auVar2,auVar2);
      auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar12,auVar12);
      auVar20 = vrsqrt14ps_avx512vl(ZEXT1632(auVar35));
      auVar21._8_4_ = 0xbf000000;
      auVar21._0_8_ = 0xbf000000bf000000;
      auVar21._12_4_ = 0xbf000000;
      auVar21._16_4_ = 0xbf000000;
      auVar21._20_4_ = 0xbf000000;
      auVar21._24_4_ = 0xbf000000;
      auVar21._28_4_ = 0xbf000000;
      auVar21 = vmulps_avx512vl(ZEXT1632(auVar35),auVar21);
      fVar27 = auVar20._0_4_;
      fVar29 = auVar20._4_4_;
      fVar30 = auVar20._8_4_;
      fVar31 = auVar20._12_4_;
      fVar32 = auVar20._16_4_;
      fVar33 = auVar20._20_4_;
      fVar34 = auVar20._24_4_;
      auVar35._0_4_ = fVar27 * fVar27;
      auVar35._4_4_ = fVar29 * fVar29;
      auVar35._8_4_ = fVar30 * fVar30;
      auVar35._12_4_ = fVar31 * fVar31;
      auVar39._4_4_ = auVar35._4_4_ * fVar29 * auVar21._4_4_;
      auVar39._0_4_ = auVar35._0_4_ * fVar27 * auVar21._0_4_;
      auVar39._8_4_ = auVar35._8_4_ * fVar30 * auVar21._8_4_;
      auVar39._12_4_ = auVar35._12_4_ * fVar31 * auVar21._12_4_;
      auVar39._16_4_ = fVar32 * fVar32 * fVar32 * auVar21._16_4_;
      auVar39._20_4_ = fVar33 * fVar33 * fVar33 * auVar21._20_4_;
      auVar39._24_4_ = fVar34 * fVar34 * fVar34 * auVar21._24_4_;
      auVar39._28_4_ = auVar21._28_4_;
      auVar24._8_4_ = 0x3fc00000;
      auVar24._0_8_ = 0x3fc000003fc00000;
      auVar24._12_4_ = 0x3fc00000;
      auVar24._16_4_ = 0x3fc00000;
      auVar24._20_4_ = 0x3fc00000;
      auVar24._24_4_ = 0x3fc00000;
      auVar24._28_4_ = 0x3fc00000;
      local_420 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                  vfmadd231ps_avx512vl(auVar39,auVar20,auVar24);
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar28._12_4_ = 0;
      auVar28._0_12_ = ZEXT812(0);
      auVar28 = auVar28 << 0x20;
      auVar35 = vpcmpeqd_avx(auVar35,auVar35);
      uVar14 = uVar16;
      do {
        lVar15 = 0;
        for (uVar17 = uVar14; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar15 = lVar15 + 1;
        }
        uVar17 = (ulong)(uint)((int)lVar15 * 4);
        auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar17 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar17 + 0xa0)),0x1c);
        fVar27 = *(float *)((long)&local_420 + uVar17);
        auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + uVar17 + 0xc0)),0x28);
        auVar40._0_4_ = auVar18._0_4_ * fVar27;
        auVar40._4_4_ = auVar18._4_4_ * fVar27;
        auVar40._8_4_ = auVar18._8_4_ * fVar27;
        auVar40._12_4_ = auVar18._12_4_ * fVar27;
        auVar18 = vshufpd_avx(auVar40,auVar40,1);
        auVar41 = vmovshdup_avx(auVar40);
        auVar42 = vunpckhps_avx(auVar40,auVar28);
        auVar19._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
        auVar19._8_8_ = auVar18._8_8_ ^ auVar25._8_8_;
        auVar19 = vinsertps_avx(auVar19,auVar40,0x2a);
        auVar18 = vdpps_avx(auVar19,auVar19,0x7f);
        auVar42 = vshufps_avx(auVar42,ZEXT416(auVar41._0_4_ ^ 0x80000000),0x41);
        auVar41 = vdpps_avx(auVar42,auVar42,0x7f);
        uVar13 = vcmpps_avx512vl(auVar18,auVar41,1);
        auVar18 = vpmovm2d_avx512vl(uVar13);
        auVar44._0_4_ = auVar18._0_4_;
        auVar44._4_4_ = auVar44._0_4_;
        auVar44._8_4_ = auVar44._0_4_;
        auVar44._12_4_ = auVar44._0_4_;
        uVar17 = vpmovd2m_avx512vl(auVar44);
        auVar18._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar35._4_4_;
        auVar18._0_4_ = (uint)((byte)uVar17 & 1) * auVar35._0_4_;
        auVar18._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar35._8_4_;
        auVar18._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar35._12_4_;
        auVar18 = vblendvps_avx(auVar19,auVar42,auVar18);
        auVar41 = vdpps_avx(auVar18,auVar18,0x7f);
        auVar19 = vrsqrt14ss_avx512f(auVar28,ZEXT416((uint)auVar41._0_4_));
        fVar29 = auVar19._0_4_;
        fVar29 = fVar29 * 1.5 - auVar41._0_4_ * 0.5 * fVar29 * fVar29 * fVar29;
        auVar42._0_4_ = auVar18._0_4_ * fVar29;
        auVar42._4_4_ = auVar18._4_4_ * fVar29;
        auVar42._8_4_ = auVar18._8_4_ * fVar29;
        auVar42._12_4_ = auVar18._12_4_ * fVar29;
        auVar18 = vshufps_avx(auVar42,auVar42,0xc9);
        auVar41 = vshufps_avx(auVar40,auVar40,0xc9);
        auVar45._0_4_ = auVar42._0_4_ * auVar41._0_4_;
        auVar45._4_4_ = auVar42._4_4_ * auVar41._4_4_;
        auVar45._8_4_ = auVar42._8_4_ * auVar41._8_4_;
        auVar45._12_4_ = auVar42._12_4_ * auVar41._12_4_;
        auVar18 = vfmsub231ps_fma(auVar45,auVar40,auVar18);
        lVar15 = lVar15 * 0x30;
        auVar41 = vshufps_avx(auVar18,auVar18,0xc9);
        auVar18 = vdpps_avx(auVar41,auVar41,0x7f);
        uVar14 = uVar14 - 1 & uVar14;
        auVar19 = vrsqrt14ss_avx512f(auVar28,ZEXT416((uint)auVar18._0_4_));
        fVar29 = auVar19._0_4_;
        fVar29 = fVar29 * 1.5 - auVar18._0_4_ * 0.5 * fVar29 * fVar29 * fVar29;
        auVar43._0_4_ = fVar29 * auVar41._0_4_;
        auVar43._4_4_ = fVar29 * auVar41._4_4_;
        auVar43._8_4_ = fVar29 * auVar41._8_4_;
        auVar43._12_4_ = fVar29 * auVar41._12_4_;
        auVar41._0_4_ = fVar27 * auVar40._0_4_;
        auVar41._4_4_ = fVar27 * auVar40._4_4_;
        auVar41._8_4_ = fVar27 * auVar40._8_4_;
        auVar41._12_4_ = fVar27 * auVar40._12_4_;
        auVar19 = vunpcklps_avx(auVar42,auVar41);
        auVar18 = vunpckhps_avx(auVar42,auVar41);
        auVar42 = vunpcklps_avx(auVar43,auVar28);
        auVar41 = vunpckhps_avx(auVar43,auVar28);
        auVar41 = vunpcklps_avx(auVar18,auVar41);
        auVar40 = vunpcklps_avx(auVar19,auVar42);
        auVar18 = vunpckhps_avx(auVar19,auVar42);
        *(undefined1 (*) [16])(local_400 + lVar15) = auVar40;
        *(undefined1 (*) [16])(auStack_3f0 + lVar15) = auVar18;
        *(undefined1 (*) [16])(auStack_3e0 + lVar15) = auVar41;
      } while (uVar14 != 0);
      local_280._0_4_ = *(undefined4 *)ray;
      local_280._4_4_ = *(undefined4 *)(ray + 4);
      local_280._8_4_ = *(undefined4 *)(ray + 8);
      local_280._12_4_ = *(undefined4 *)(ray + 0xc);
      local_280._16_4_ = *(undefined4 *)(ray + 0x10);
      local_280._20_4_ = *(undefined4 *)(ray + 0x14);
      local_280._24_4_ = *(undefined4 *)(ray + 0x18);
      local_280._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_280._32_4_ = *(undefined4 *)(ray + 0x20);
      local_280._36_4_ = *(undefined4 *)(ray + 0x24);
      local_280._40_4_ = *(undefined4 *)(ray + 0x28);
      local_280._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_280._48_4_ = *(undefined4 *)(ray + 0x30);
      local_280._52_4_ = *(undefined4 *)(ray + 0x34);
      local_280._56_4_ = *(undefined4 *)(ray + 0x38);
      local_280._60_4_ = *(undefined4 *)(ray + 0x3c);
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar36._16_4_ = 0x7fffffff;
      auVar36._20_4_ = 0x7fffffff;
      auVar36._24_4_ = 0x7fffffff;
      auVar36._28_4_ = 0x7fffffff;
      auVar21 = vandps_avx(auVar12,auVar36);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      auVar37._16_4_ = 0x219392ef;
      auVar37._20_4_ = 0x219392ef;
      auVar37._24_4_ = 0x219392ef;
      auVar37._28_4_ = 0x219392ef;
      uVar14 = vcmpps_avx512vl(auVar21,auVar37,1);
      auVar21 = vandps_avx(auVar2,auVar36);
      uVar17 = vcmpps_avx512vl(auVar21,auVar37,1);
      local_280._64_4_ = *(undefined4 *)(ray + 0x40);
      local_280._68_4_ = *(undefined4 *)(ray + 0x44);
      local_280._72_4_ = *(undefined4 *)(ray + 0x48);
      local_280._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_280._80_4_ = *(undefined4 *)(ray + 0x50);
      local_280._84_4_ = *(undefined4 *)(ray + 0x54);
      local_280._88_4_ = *(undefined4 *)(ray + 0x58);
      local_280._92_4_ = *(undefined4 *)(ray + 0x5c);
      bVar4 = (bool)((byte)uVar14 & 1);
      auVar20._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._0_4_;
      bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar20._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._4_4_;
      bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar20._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._8_4_;
      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar20._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._12_4_;
      bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
      auVar20._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._16_4_;
      bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
      auVar20._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._20_4_;
      bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
      auVar20._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._24_4_;
      bVar4 = SUB81(uVar14 >> 7,0);
      auVar20._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar12._28_4_;
      bVar4 = (bool)((byte)uVar17 & 1);
      auVar22._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._0_4_;
      bVar4 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._4_4_;
      bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._8_4_;
      bVar4 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._12_4_;
      bVar4 = (bool)((byte)(uVar17 >> 4) & 1);
      auVar22._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._16_4_;
      bVar4 = (bool)((byte)(uVar17 >> 5) & 1);
      auVar22._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._20_4_;
      bVar4 = (bool)((byte)(uVar17 >> 6) & 1);
      auVar22._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._24_4_;
      bVar4 = SUB81(uVar17 >> 7,0);
      auVar22._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._28_4_;
      auVar21 = vandps_avx(auVar3,auVar36);
      uVar14 = vcmpps_avx512vl(auVar21,auVar37,1);
      bVar4 = (bool)((byte)uVar14 & 1);
      auVar23._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)fVar5;
      bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)fVar6;
      bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)fVar7;
      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)fVar8;
      bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
      auVar23._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)fVar9;
      bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
      auVar23._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)fVar10;
      bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
      auVar23._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)fVar11;
      bVar4 = SUB81(uVar14 >> 7,0);
      auVar23._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar3._28_4_;
      auVar21 = vrcp14ps_avx512vl(auVar20);
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = &DAT_3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      auVar38._16_4_ = 0x3f800000;
      auVar38._20_4_ = 0x3f800000;
      auVar38._24_4_ = 0x3f800000;
      auVar38._28_4_ = 0x3f800000;
      auVar35 = vfnmadd213ps_fma(auVar20,auVar21,auVar38);
      auVar35 = vfmadd132ps_fma(ZEXT1632(auVar35),auVar21,auVar21);
      auVar21 = vrcp14ps_avx512vl(auVar22);
      auVar28 = vfnmadd213ps_fma(auVar22,auVar21,auVar38);
      auVar28 = vfmadd132ps_fma(ZEXT1632(auVar28),auVar21,auVar21);
      auVar21 = vrcp14ps_avx512vl(auVar23);
      auVar25 = vfnmadd213ps_fma(auVar23,auVar21,auVar38);
      local_1c0 = ZEXT1632(auVar35);
      local_1a0 = ZEXT1632(auVar28);
      auVar25 = vfmadd132ps_fma(ZEXT1632(auVar25),auVar21,auVar21);
      local_180 = ZEXT1632(auVar25);
      local_160 = (float)local_280._0_4_ * auVar35._0_4_;
      fStack_15c = (float)local_280._4_4_ * auVar35._4_4_;
      fStack_158 = (float)local_280._8_4_ * auVar35._8_4_;
      fStack_154 = (float)local_280._12_4_ * auVar35._12_4_;
      fStack_150 = (float)local_280._16_4_ * 0.0;
      fStack_14c = (float)local_280._20_4_ * 0.0;
      fStack_148 = (float)local_280._24_4_ * 0.0;
      local_140 = (float)local_280._32_4_ * auVar28._0_4_;
      fStack_13c = (float)local_280._36_4_ * auVar28._4_4_;
      fStack_138 = (float)local_280._40_4_ * auVar28._8_4_;
      fStack_134 = (float)local_280._44_4_ * auVar28._12_4_;
      fStack_130 = (float)local_280._48_4_ * 0.0;
      fStack_12c = (float)local_280._52_4_ * 0.0;
      fStack_128 = (float)local_280._56_4_ * 0.0;
      local_120 = (float)local_280._64_4_ * auVar25._0_4_;
      fStack_11c = (float)local_280._68_4_ * auVar25._4_4_;
      fStack_118 = (float)local_280._72_4_ * auVar25._8_4_;
      fStack_114 = (float)local_280._76_4_ * auVar25._12_4_;
      fStack_110 = (float)local_280._80_4_ * 0.0;
      fStack_10c = (float)local_280._84_4_ * 0.0;
      uStack_104 = auVar21._28_4_;
      fStack_108 = (float)local_280._88_4_ * 0.0;
      auVar24 = ZEXT1232(ZEXT812(0)) << 0x20;
      uVar14 = vcmpps_avx512vl(ZEXT1632(auVar35),auVar24,1);
      auVar21 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_100 = (uint)((byte)uVar14 & 1) * auVar21._0_4_;
      iStack_fc = (uint)((byte)(uVar14 >> 1) & 1) * auVar21._4_4_;
      iStack_f8 = (uint)((byte)(uVar14 >> 2) & 1) * auVar21._8_4_;
      iStack_f4 = (uint)((byte)(uVar14 >> 3) & 1) * auVar21._12_4_;
      iStack_f0 = (uint)((byte)(uVar14 >> 4) & 1) * auVar21._16_4_;
      iStack_ec = (uint)((byte)(uVar14 >> 5) & 1) * auVar21._20_4_;
      iStack_e8 = (uint)((byte)(uVar14 >> 6) & 1) * auVar21._24_4_;
      iStack_e4 = (uint)(byte)(uVar14 >> 7) * auVar21._28_4_;
      uVar14 = vcmpps_avx512vl(ZEXT1632(auVar28),auVar24,5);
      auVar21 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar4 = (bool)((byte)uVar14 & 1);
      local_e0._0_4_ = (uint)bVar4 * auVar21._0_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
      local_e0._4_4_ = (uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
      local_e0._8_4_ = (uint)bVar4 * auVar21._8_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
      local_e0._12_4_ = (uint)bVar4 * auVar21._12_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
      local_e0._16_4_ = (uint)bVar4 * auVar21._16_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
      local_e0._20_4_ = (uint)bVar4 * auVar21._20_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
      local_e0._24_4_ = (uint)bVar4 * auVar21._24_4_ | (uint)!bVar4 * 0x60;
      bVar4 = SUB81(uVar14 >> 7,0);
      local_e0._28_4_ = (uint)bVar4 * auVar21._28_4_ | (uint)!bVar4 * 0x60;
      auVar21 = vpcmpeqd_avx2(local_e0,local_e0);
      auVar39 = ZEXT1232(ZEXT812(0)) << 0x20;
      uVar14 = vcmpps_avx512vl(ZEXT1632(auVar25),auVar39,5);
      auVar24 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar4 = (bool)((byte)uVar14 & 1);
      local_c0 = (uint)bVar4 * auVar24._0_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
      uStack_bc = (uint)bVar4 * auVar24._4_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
      uStack_b8 = (uint)bVar4 * auVar24._8_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
      uStack_b4 = (uint)bVar4 * auVar24._12_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
      uStack_b0 = (uint)bVar4 * auVar24._16_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
      uStack_ac = (uint)bVar4 * auVar24._20_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
      uStack_a8 = (uint)bVar4 * auVar24._24_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = SUB81(uVar14 >> 7,0);
      uStack_a4 = (uint)bVar4 * auVar24._28_4_ | (uint)!bVar4 * 0xa0;
      uVar14 = vpcmpeqd_avx512vl((undefined1  [32])aVar1,auVar21);
      auVar21 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar39);
      bVar4 = (bool)((byte)uVar14 & 1);
      local_a0 = (uint)bVar4 * auVar21._0_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
      uStack_9c = (uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
      uStack_98 = (uint)bVar4 * auVar21._8_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
      uStack_94 = (uint)bVar4 * auVar21._12_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
      uStack_90 = (uint)bVar4 * auVar21._16_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
      uStack_8c = (uint)bVar4 * auVar21._20_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
      uStack_88 = (uint)bVar4 * auVar21._24_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = SUB81(uVar14 >> 7,0);
      uStack_84 = (uint)bVar4 * auVar21._28_4_ | (uint)!bVar4 * 0x7f800000;
      auVar21 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar39);
      bVar4 = (bool)((byte)uVar14 & 1);
      local_80 = (uint)bVar4 * auVar21._0_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
      uStack_7c = (uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
      uStack_78 = (uint)bVar4 * auVar21._8_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
      uStack_74 = (uint)bVar4 * auVar21._12_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
      uStack_70 = (uint)bVar4 * auVar21._16_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
      uStack_6c = (uint)bVar4 * auVar21._20_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
      uStack_68 = (uint)bVar4 * auVar21._24_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = SUB81(uVar14 >> 7,0);
      uStack_64 = (uint)bVar4 * auVar21._28_4_ | (uint)!bVar4 * -0x800000;
      local_220 = auVar12;
      local_200 = auVar2;
      local_1e0 = auVar3;
      uStack_144 = local_280._28_4_;
      uStack_124 = local_280._60_4_;
      do {
        k = 0;
        for (uVar14 = uVar16; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
          k = k + 1;
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,(Precalculations *)&local_420,ray,
                   (TravRayK<8,_false> *)&local_280.field_0,context);
        uVar16 = uVar16 - 1 & uVar16;
      } while (uVar16 != 0);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }